

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

int __thiscall testing::internal::UnitTestImpl::failed_test_suite_count(UnitTestImpl *this)

{
  TestSuite *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  pointer ppTVar4;
  int iVar5;
  
  ppTVar4 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar4 ==
      (this->test_suites_).
      super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    do {
      this_00 = *ppTVar4;
      uVar3 = 0;
      if (this_00->should_run_ == true) {
        iVar2 = TestSuite::failed_test_count(this_00);
        uVar3 = 1;
        if (iVar2 < 1) {
          bVar1 = TestResult::Failed(&this_00->ad_hoc_test_result_);
          uVar3 = (uint)bVar1;
        }
      }
      iVar5 = iVar5 + uVar3;
      ppTVar4 = ppTVar4 + 1;
    } while (ppTVar4 !=
             (this->test_suites_).
             super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  return iVar5;
}

Assistant:

int UnitTestImpl::failed_test_suite_count() const {
  return CountIf(test_suites_, TestSuiteFailed);
}